

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O0

void lj_record_ins(jit_State *J)

{
  IROp IVar1;
  long lVar2;
  double dVar3;
  undefined2 uVar4;
  TRef TVar5;
  IROp op_00;
  uint uVar6;
  int iVar7;
  int iVar8;
  LoopEvent LVar9;
  int *piVar10;
  ulong uVar11;
  TValue *in_RDI;
  bool bVar12;
  TValue *b;
  MMS mm;
  int diff;
  int irop;
  IRType tc;
  IRType ta;
  GCstr *s_2;
  cTValue *tv_2;
  TValue *tv_1;
  BCReg s_1;
  TValue *tv;
  BCReg s;
  SnapShot *snap;
  TRef rc;
  TRef rb;
  TRef ra;
  BCOp op;
  BCIns ins;
  BCIns *pc;
  RecordIndex ix;
  cTValue *lbase;
  LoopEvent in_stack_fffffffffffffad8;
  TraceLink in_stack_fffffffffffffadc;
  TValue *in_stack_fffffffffffffae0;
  MMS mm_00;
  undefined4 in_stack_fffffffffffffae8;
  BCReg in_stack_fffffffffffffaec;
  TRef rc_00;
  TValue *in_stack_fffffffffffffaf0;
  IRType t;
  undefined4 in_stack_fffffffffffffaf8;
  TRef in_stack_fffffffffffffafc;
  jit_State *in_stack_fffffffffffffb00;
  undefined4 in_stack_fffffffffffffb08;
  undefined4 in_stack_fffffffffffffb0c;
  undefined8 in_stack_fffffffffffffb20;
  BCIns *in_stack_fffffffffffffb28;
  uint32_t uv;
  TValue *in_stack_fffffffffffffb30;
  jit_State *in_stack_fffffffffffffb38;
  TRef tr;
  jit_State *in_stack_fffffffffffffb40;
  jit_State *in_stack_fffffffffffffb48;
  TRef local_4ac;
  TRef local_4a8;
  TRef local_4a4;
  ptrdiff_t in_stack_fffffffffffffb60;
  TValue *pTVar13;
  undefined8 in_stack_fffffffffffffb68;
  BCReg rbase;
  undefined4 in_stack_fffffffffffffb70;
  undefined4 in_stack_fffffffffffffb74;
  TRef local_47c;
  uint local_46c;
  uint in_stack_fffffffffffffb9c;
  jit_State *in_stack_fffffffffffffba0;
  IROp local_444;
  uint local_43c;
  undefined4 in_stack_fffffffffffffbe0;
  uint in_stack_fffffffffffffbe4;
  uint uVar14;
  TRef local_3fc;
  uint uVar15;
  IROp dst;
  jit_State *J_00;
  undefined8 local_3e0;
  undefined8 local_3d8;
  double local_3d0 [4];
  uint local_3b0;
  TRef local_3ac;
  uint local_3a8;
  undefined4 local_39c;
  long local_398;
  TValue *local_390;
  undefined2 local_386;
  undefined2 local_384;
  undefined2 local_382;
  undefined2 local_376;
  undefined2 local_374;
  undefined2 local_372;
  undefined2 local_366;
  undefined2 local_364;
  undefined2 local_362;
  TValue *local_360;
  undefined2 local_356;
  undefined2 local_354;
  ushort local_352;
  TValue *local_350;
  undefined2 local_346;
  undefined2 local_344;
  undefined2 local_342;
  TValue *local_340;
  undefined2 local_336;
  undefined2 local_334;
  undefined2 local_332;
  TValue *local_330;
  uint local_324;
  undefined8 *local_320;
  undefined8 *local_318;
  TValue local_310;
  undefined8 *local_308;
  undefined8 *local_300;
  TValue local_2f8;
  undefined8 *local_2f0;
  undefined8 *local_2e8;
  TValue local_2e0;
  double *local_2d8;
  undefined8 *local_2d0;
  TValue local_2c8;
  undefined8 *local_2c0;
  undefined8 *local_2b8;
  TValue local_2b0;
  undefined8 *local_2a8;
  double *local_2a0;
  TValue local_298;
  undefined8 *local_290;
  undefined8 *local_288;
  TValue local_280;
  double *local_278;
  undefined8 *local_270;
  TValue local_268;
  double *local_260;
  undefined8 *local_258;
  TValue local_250;
  double *local_248;
  undefined8 *local_240;
  TValue local_238;
  double *local_230;
  double *local_228;
  TValue local_220;
  ulong local_218;
  undefined8 *local_210;
  TValue local_208;
  ulong local_200;
  undefined8 *local_1f8;
  TValue local_1f0;
  undefined8 *local_1e8;
  double *local_1e0;
  undefined8 *local_1d8;
  double *local_1d0;
  IROp local_1c4;
  TValue *local_1c0;
  uint local_1b4;
  undefined8 *local_1b0;
  char *local_1a8;
  double *local_1a0;
  TValue local_198;
  char *local_190;
  undefined8 *local_188;
  TValue local_180;
  char *local_178;
  undefined8 *local_170;
  TValue local_168;
  char *local_160;
  undefined8 *local_158;
  TValue local_150;
  char *local_148;
  undefined8 *local_140;
  TValue local_138;
  char *local_130;
  double *local_128;
  TValue local_120;
  char *local_118;
  undefined8 *local_110;
  TValue local_108;
  char *local_100;
  undefined8 *local_f8;
  TValue local_f0;
  char *local_e8;
  undefined8 *local_e0;
  TValue local_d8;
  char *local_d0;
  undefined8 *local_c8;
  TValue local_c0;
  char *local_b8;
  undefined8 *local_b0;
  TValue local_a8;
  undefined4 local_9c;
  ulong local_98;
  undefined8 *local_90;
  TValue local_88;
  char *local_80;
  undefined8 *local_78;
  TValue local_70;
  undefined4 local_64;
  ulong local_60;
  undefined8 *local_58;
  TValue local_50;
  char *local_48;
  undefined8 *local_40;
  TValue local_38;
  undefined4 local_2c;
  ulong local_28;
  undefined8 *local_20;
  undefined4 local_14;
  ulong local_10;
  undefined8 *local_8;
  
  rbase = (BCReg)((ulong)in_stack_fffffffffffffb68 >> 0x20);
  iVar8 = (int)((ulong)in_stack_fffffffffffffb20 >> 0x20);
  local_390 = in_RDI;
  if (*(int *)((long)in_RDI + 0x164) != 0) {
    in_stack_fffffffffffffba0 = (jit_State *)(ulong)(*(int *)((long)in_RDI + 0x164) - 1);
    switch(in_stack_fffffffffffffba0) {
    case (jit_State *)0x0:
      rec_comp_fixup(in_stack_fffffffffffffb00,
                     (BCIns *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),
                     (int)((ulong)in_stack_fffffffffffffaf0 >> 0x20));
    case (jit_State *)0x1:
    case (jit_State *)0x2:
      if ((0xfffffffd < *(uint *)((long)local_390 + -0x124)) &&
         (*(byte *)((long)local_390 + 0xa5) = *(byte *)((long)local_390 + 0xa5) ^ 1,
         *(int *)((long)local_390 + 0x164) == 3)) {
        piVar10 = (int *)(local_390[4].u64 +
                         (long)(int)(*(ushort *)((long)&(local_390->field_2).it + 2) - 1) * 0xc);
        uVar11 = (ulong)((*piVar10 + (uint)*(byte *)((long)piVar10 + 10)) - 1);
        *(int *)(local_390[5].u64 + uVar11 * 4) = *(int *)(local_390[5].u64 + uVar11 * 4) + -1;
      }
      lj_opt_fold((jit_State *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
    case (jit_State *)0x3:
      if (0xfffffffd < *(uint *)((long)local_390 + -0x124)) {
        for (uVar14 = 0; uVar14 < *(uint *)((long)local_390 + 0x94); uVar14 = uVar14 + 1) {
          if ((*(int *)(local_390[0x11].u64 + (ulong)uVar14 * 4) == 0x2007ffd) &&
             (*(int *)(*(long *)(local_390[0xd].u64 + 0x10) + 4 + (ulong)uVar14 * 8) == -2)) {
            *(undefined4 *)(local_390[0x11].u64 + (ulong)uVar14 * 4) = 0x1007ffe;
            break;
          }
        }
      }
      break;
    case (jit_State *)0x4:
      lVar2 = *(long *)(in_RDI[0xd].u64 + 0x10);
      in_stack_fffffffffffffbe4 = 0;
      while( true ) {
        rbase = (BCReg)((ulong)in_stack_fffffffffffffb68 >> 0x20);
        iVar8 = (int)((ulong)in_stack_fffffffffffffb20 >> 0x20);
        if (*(uint *)((long)local_390 + 0x94) <= in_stack_fffffffffffffbe4) break;
        if ((*(int *)(local_390[0x11].u64 + (ulong)in_stack_fffffffffffffbe4 * 4) == 0x7fff) &&
           (*(int *)(lVar2 + 4 + (ulong)in_stack_fffffffffffffbe4 * 8) != -1)) {
          TVar5 = lj_record_constify((jit_State *)
                                     CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),
                                     in_stack_fffffffffffffaf0);
          *(TRef *)(local_390[0x11].u64 + (ulong)in_stack_fffffffffffffbe4 * 4) = TVar5;
        }
        in_stack_fffffffffffffbe4 = in_stack_fffffffffffffbe4 + 1;
      }
      break;
    case (jit_State *)0x5:
      if (0x60 < (*(uint *)in_RDI[0xe] & 0xff)) {
        return;
      }
    }
    *(undefined4 *)((long)local_390 + 0x164) = 0;
  }
  if (*(char *)((long)local_390 + 0x9d) != '\0') {
    *(undefined1 *)((long)local_390 + 0x9d) = 0;
    if (local_390[0x10].u64 != 0) {
      lj_snap_purge((jit_State *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0));
    }
    lj_snap_add((jit_State *)&in_stack_fffffffffffffae0->field_2);
    *(undefined1 *)((long)local_390 + 0x9c) = 1;
  }
  if (*(char *)((long)local_390 + 0x9f) != '\0') {
    *(char *)((long)local_390 + 0x9f) = *(char *)((long)local_390 + 0x9f) + -1;
    return;
  }
  J_00 = (jit_State *)local_390[0xe].u64;
  if ((*(int *)((long)local_390 + 0xe4) == 0) &&
     (local_390[0x1a].u32.lo <= (int)J_00 - local_390[0x19].u32.lo)) {
    lj_trace_err((jit_State *)&in_stack_fffffffffffffae0->field_2,in_stack_fffffffffffffadc);
  }
  rec_profile_ins((jit_State *)&in_stack_fffffffffffffae0->field_2,
                  (BCIns *)CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8));
  local_398 = *(long *)(local_390[0xd].u64 + 0x10);
  IVar1 = (J_00->cur).nextgc.gcptr32;
  op_00 = IVar1 & 0xff;
  uVar14 = IVar1 >> 8 & 0xff;
  local_3a8 = 0;
  dst = IVar1;
  if ((lj_bc_mode[op_00] & 7) == 3) {
    local_220 = local_390[0xd];
    local_228 = local_3d0;
    local_230 = (double *)(local_398 + (ulong)uVar14 * 8);
    local_3d0[0] = *local_230;
    local_1a8 = "copy of dead GC object";
    local_1a0 = local_228;
    local_198 = local_220;
    if (*(int *)(local_390[0x11].u64 + (ulong)uVar14 * 4) == 0) {
      in_stack_fffffffffffffb9c =
           sload((jit_State *)&in_stack_fffffffffffffae0->field_2,in_stack_fffffffffffffadc);
      uVar14 = in_stack_fffffffffffffb9c;
      local_3a8 = in_stack_fffffffffffffb9c;
    }
    else {
      in_stack_fffffffffffffb9c = *(uint *)(local_390[0x11].u64 + (ulong)uVar14 * 4);
      uVar14 = in_stack_fffffffffffffb9c;
      local_3a8 = in_stack_fffffffffffffb9c;
    }
  }
  local_46c = dst >> 0x18;
  local_3fc = dst >> 0x10 & 0xff;
  uVar6 = lj_bc_mode[op_00] >> 3 & 0xf;
  if ((lj_bc_mode[op_00] >> 3 & 0xf) == 0) {
    local_46c = 0;
    local_3fc = dst >> 0x10;
  }
  else if (uVar6 == 3) {
    local_238 = local_390[0xd];
    local_240 = &local_3e0;
    local_248 = (double *)(local_398 + (ulong)local_46c * 8);
    local_3e0 = *local_248;
    local_190 = "copy of dead GC object";
    local_188 = local_240;
    local_180 = local_238;
    if (*(int *)(local_390[0x11].u64 + (ulong)local_46c * 4) == 0) {
      local_46c = sload((jit_State *)&in_stack_fffffffffffffae0->field_2,in_stack_fffffffffffffadc);
    }
    else {
      local_46c = *(uint *)(local_390[0x11].u64 + (ulong)local_46c * 4);
    }
    local_3b0 = local_46c;
  }
  switch(lj_bc_mode[op_00] >> 7 & 0xf) {
  case 3:
    local_250 = local_390[0xd];
    local_258 = &local_3d8;
    local_260 = (double *)(local_398 + (ulong)local_3fc * 8);
    local_3d8 = *local_260;
    local_178 = "copy of dead GC object";
    local_170 = local_258;
    local_168 = local_250;
    if (*(int *)(local_390[0x11].u64 + (ulong)local_3fc * 4) == 0) {
      local_47c = sload((jit_State *)&in_stack_fffffffffffffae0->field_2,in_stack_fffffffffffffadc);
    }
    else {
      local_47c = *(TRef *)(local_390[0x11].u64 + (ulong)local_3fc * 4);
    }
    local_3fc = local_47c;
    local_3ac = local_47c;
    break;
  default:
    break;
  case 8:
    local_3d8 = (double)(CONCAT44(local_3fc,(undefined4)local_3d8) ^ 0xffffffff00000000);
    local_3fc = local_3fc * 0xffffff + 0x7fff;
    local_3ac = local_3fc;
    break;
  case 9:
    local_278 = (double *)((ulong)*(uint *)(local_390[0x10].u64 + 0x10) + (ulong)local_3fc * 8);
    local_268 = local_390[0xd];
    local_270 = &local_3d8;
    local_3d8 = *local_278;
    local_160 = "copy of dead GC object";
    local_158 = local_270;
    local_150 = local_268;
    local_3fc = lj_ir_knumint((jit_State *)&in_stack_fffffffffffffae0->field_2,
                              (lua_Number)
                              CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8));
    local_3ac = local_3fc;
    break;
  case 10:
    uVar15 = *(uint *)((ulong)*(uint *)(local_390[0x10].u64 + 0x10) +
                      ((ulong)local_3fc ^ 0xffffffffffffffff) * 4);
    local_200 = (ulong)uVar15;
    local_1f0 = local_390[0xd];
    local_1f8 = &local_3d8;
    local_9c = 0xfffffffb;
    local_14 = 0xfffffffb;
    local_3d8 = (double)CONCAT44(local_3d8._4_4_,uVar15);
    local_3d8._4_4_ = 0xfffffffb;
    local_80 = "store to dead GC object";
    local_98 = local_200;
    local_90 = local_1f8;
    local_88 = local_1f0;
    local_78 = local_1f8;
    local_70 = local_1f0;
    local_10 = local_200;
    local_8 = local_1f8;
    local_3fc = lj_ir_kgc(in_stack_fffffffffffffb00,
                          (GCobj *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),
                          (IRType)((ulong)in_stack_fffffffffffffaf0 >> 0x20));
    local_3ac = local_3fc;
  }
  dVar3 = local_3e0;
  tr = (TRef)((ulong)in_stack_fffffffffffffb38 >> 0x20);
  t = (IRType)((ulong)in_stack_fffffffffffffaf0 >> 0x20);
  mm_00 = (MMS)((ulong)in_stack_fffffffffffffae0 >> 0x20);
  uv = (uint32_t)((ulong)in_stack_fffffffffffffb28 >> 0x20);
  uVar4 = (undefined2)local_3fc;
  rc_00 = (TRef)in_stack_fffffffffffffaf0;
  TVar5 = local_3fc;
  uVar15 = local_46c;
  switch(op_00) {
  case IR_LT:
  case IR_GE:
  case IR_LE:
  case IR_GT:
    if (((uVar14 & 0x1f000000) == 0xa000000) || ((local_3fc & 0x1f000000) == 0xa000000)) {
      rec_mm_comp_cdata((jit_State *)&in_stack_fffffffffffffae0->field_2,
                        (RecordIndex *)CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8)
                        ,0,0x180145);
    }
    else if (((0x7fff < ((uVar14 | local_3fc) & 0xffff)) ||
             ((5 < (uVar14 >> 0x18 & 0x1f) - 0xe && ((uVar14 & 0x1f000000) != 0x4000000)))) ||
            ((5 < (local_3fc >> 0x18 & 0x1f) - 0xe && ((local_3fc & 0x1f000000) != 0x4000000)))) {
      if ((uVar14 >> 0x18 & 0x1f) - 0xf < 5) {
        local_43c = 0x13;
      }
      else {
        local_43c = uVar14 >> 0x18 & 0x1f;
      }
      if ((local_3fc >> 0x18 & 0x1f) - 0xf < 5) {
        uVar6 = 0x13;
      }
      else {
        uVar6 = local_3fc >> 0x18 & 0x1f;
      }
      if (local_43c != uVar6) {
        if ((local_43c == 0x13) && (uVar6 == 0xe)) {
          local_330 = local_390;
          local_332 = 0x590e;
          local_334 = (undefined2)uVar14;
          local_336 = 0x1d3;
          *(undefined2 *)((long)local_390 + 0xa4) = 0x590e;
          *(undefined2 *)(local_390 + 0x14) = local_334;
          *(undefined2 *)((long)local_390 + 0xa2) = 0x1d3;
          uVar14 = lj_opt_fold((jit_State *)
                               CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
          local_43c = 0xe;
        }
        else if ((local_43c == 0xe) && (uVar6 == 0x13)) {
          local_340 = local_390;
          local_342 = 0x590e;
          local_346 = 0x1d3;
          *(undefined2 *)((long)local_390 + 0xa4) = 0x590e;
          *(undefined2 *)(local_390 + 0x14) = uVar4;
          *(undefined2 *)((long)local_390 + 0xa2) = 0x1d3;
          local_344 = uVar4;
          local_3fc = lj_opt_fold((jit_State *)
                                  CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
        }
        else if (((local_43c != 1) && (local_43c != 2)) || ((uVar6 != 1 && (uVar6 != 2)))) break;
      }
      rec_comp_prep((jit_State *)0x1803fa);
      local_444 = op_00;
      if (local_43c == 0xe) {
        if ((IVar1 & IR_GE) != IR_LT) {
          local_444 = op_00 ^ IR_ULT;
        }
        local_1d0 = local_3d0;
        local_1d8 = &local_3d8;
        iVar7 = lj_ir_numcmp(local_3d0[0],local_3d8,local_444);
        iVar8 = (int)((ulong)in_stack_fffffffffffffaf0 >> 0x20);
        if (iVar7 == 0) {
          local_444 = local_444 ^ IR_UGE;
        }
      }
      else if (local_43c == 0x13) {
        local_1e0 = local_3d0;
        local_1e8 = &local_3d8;
        iVar7 = lj_ir_numcmp(local_3d0[0],local_3d8,op_00);
        iVar8 = (int)((ulong)in_stack_fffffffffffffaf0 >> 0x20);
        if (iVar7 == 0) {
          local_444 = op_00 ^ IR_GE;
        }
      }
      else {
        if (local_43c != 4) {
          rec_mm_comp(in_stack_fffffffffffffb00,
                      (RecordIndex *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),
                      (int)((ulong)in_stack_fffffffffffffaf0 >> 0x20));
          break;
        }
        iVar8 = lj_ir_strcmp((GCstr *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8),
                             (GCstr *)&in_stack_fffffffffffffae0->field_2,in_stack_fffffffffffffadc)
        ;
        if (iVar8 == 0) {
          local_444 = op_00 ^ IR_GE;
        }
        uVar14 = lj_ir_call((jit_State *)&local_390->field_2,IRCALL_lj_str_cmp,(ulong)uVar14,
                            (ulong)local_3fc);
        local_3fc = lj_ir_kint((jit_State *)&in_stack_fffffffffffffaf0->field_2,
                               in_stack_fffffffffffffaec);
        iVar8 = (int)((ulong)in_stack_fffffffffffffaf0 >> 0x20);
        local_43c._0_2_ = 0x13;
      }
      local_352 = (ushort)(local_444 << 8) | (ushort)local_43c | 0x80;
      local_354 = (undefined2)uVar14;
      local_350 = local_390;
      local_356 = (undefined2)local_3fc;
      *(ushort *)((long)local_390 + 0xa4) = local_352;
      *(undefined2 *)(local_390 + 0x14) = local_354;
      *(undefined2 *)((long)local_390 + 0xa2) = local_356;
      lj_opt_fold((jit_State *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
      rec_comp_fixup(in_stack_fffffffffffffb00,
                     (BCIns *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),iVar8);
    }
    break;
  case IR_ULT:
  case IR_UGE:
  case IR_ULE:
  case IR_UGT:
  case IR_EQ:
  case IR_NE:
  case IR_ABC:
  case IR_RETF:
    if (((uVar14 & 0x1f000000) == 0xa000000) || ((local_3fc & 0x1f000000) == 0xa000000)) {
      rec_mm_comp_cdata((jit_State *)&in_stack_fffffffffffffae0->field_2,
                        (RecordIndex *)CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8)
                        ,0,0x1806dd);
    }
    else if (((0x7fff < ((uVar14 | local_3fc) & 0xffff)) || ((uVar14 & 0x1f000000) == 0xb000000)) ||
            ((uVar14 & 0x1f000000) == 0xc000000)) {
      rec_comp_prep((jit_State *)0x180731);
      iVar8 = lj_record_objcmp((jit_State *)
                               CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08),
                               (TRef)((ulong)in_stack_fffffffffffffb00 >> 0x20),
                               (TRef)in_stack_fffffffffffffb00,
                               (cTValue *)
                               CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),
                               in_stack_fffffffffffffaf0);
      iVar7 = (int)((ulong)in_stack_fffffffffffffaf0 >> 0x20);
      if ((iVar8 == 2) ||
         (((uVar14 & 0x1f000000) != 0xb000000 && ((uVar14 & 0x1f000000) != 0xc000000)))) {
        rec_comp_fixup(in_stack_fffffffffffffb00,
                       (BCIns *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),iVar7)
        ;
      }
      else if (iVar8 == 1) {
        rec_mm_equal(in_stack_fffffffffffffb00,
                     (RecordIndex *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),
                     iVar7);
      }
    }
    break;
  case IR_NOP:
  case IR_BASE:
    if ((IVar1 & IR_GE) == (uint)(1 < (local_3fc >> 0x18 & 0x1f))) {
      local_3fc = 0;
    }
  case IR_PVAL:
  case IR_GCSTEP:
    uVar6._0_1_ = (J_00->cur).marked;
    uVar6._1_1_ = (J_00->cur).gct;
    uVar6._2_2_ = (J_00->cur).nsnap;
    if ((uVar6 >> 8 & 0xff) < *(uint *)((long)local_390 + 0x94)) {
      uVar15._0_1_ = (J_00->cur).marked;
      uVar15._1_1_ = (J_00->cur).gct;
      uVar15._2_2_ = (J_00->cur).nsnap;
      *(uint *)((long)local_390 + 0x94) = uVar15 >> 8 & 0xff;
    }
    break;
  case IR_HIOP:
  case IR_LOOP:
    if (local_3fc == 0xf) {
      uVar14 = lj_ir_tonum((jit_State *)&in_stack_fffffffffffffae0->field_2,
                           in_stack_fffffffffffffadc);
    }
    else if (local_3fc == 5) {
      uVar14 = lj_ir_tostr((jit_State *)&in_stack_fffffffffffffae0->field_2,
                           in_stack_fffffffffffffadc);
    }
    *(uint *)(local_390[0x11].u64 + (ulong)(dst >> 8 & 0xff) * 4) = uVar14;
    break;
  case IR_USE:
    if (*(uint *)((long)local_390 + 0x94) < uVar14) {
      *(undefined4 *)(local_390[0x11].u64 + (ulong)(uVar14 - 1) * 4) = 0;
    }
    break;
  case IR_PHI:
    uVar6 = local_3fc >> 0x18;
    local_3fc = 0x2007ffd;
    if (1 < (uVar6 & 0x1f)) {
      local_3fc = 0x1007ffe;
    }
    break;
  case IR_RENAME:
    if (((local_3fc >> 0x18 & 0x1f) - 0xe < 6) || ((local_3fc & 0x1f000000) == 0x4000000)) {
      local_3fc = lj_opt_narrow_unm(in_stack_fffffffffffffb00,in_stack_fffffffffffffafc,
                                    in_stack_fffffffffffffaf0);
    }
    else {
      local_3b0 = local_3fc;
      local_280 = local_390[0xd];
      local_288 = &local_3e0;
      local_290 = &local_3d8;
      local_3e0 = local_3d8;
      local_148 = "copy of dead GC object";
      local_140 = local_288;
      local_138 = local_280;
      local_3fc = rec_mm_arith((jit_State *)&in_stack_fffffffffffffaf0->field_2,
                               (RecordIndex *)
                               CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8),mm_00);
    }
    break;
  case IR_PROF:
    if ((local_3fc & 0x1f000000) == 0x4000000) {
      local_360 = local_390;
      local_362 = 0x4413;
      local_366 = 0;
      *(undefined2 *)((long)local_390 + 0xa4) = 0x4413;
      *(undefined2 *)(local_390 + 0x14) = uVar4;
      *(undefined2 *)((long)local_390 + 0xa2) = 0;
      local_364 = uVar4;
      local_3fc = lj_opt_fold((jit_State *)
                              CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
    }
    else if ((local_3fc & 0x1f000000) == 0xb000000) {
      local_3fc = lj_ir_call((jit_State *)&local_390->field_2,IRCALL_lj_tab_len,(ulong)local_3fc);
    }
    else {
      local_3fc = rec_mm_len(in_stack_fffffffffffffb40,tr,in_stack_fffffffffffffb30);
    }
    break;
  case IR_KKPTR:
  case IR_BSHL:
    uVar6 = local_46c;
LAB_00180df0:
    local_3fc = TVar5;
    if ((((uVar6 >> 0x18 & 0x1f) - 0xe < 6) || ((uVar6 & 0x1f000000) == 0x4000000)) &&
       (((local_3fc >> 0x18 & 0x1f) - 0xe < 6 || ((local_3fc & 0x1f000000) == 0x4000000)))) {
      local_3fc = lj_opt_narrow_mod((jit_State *)
                                    CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),t,
                                    rc_00,(TValue *)
                                          CONCAT44(in_stack_fffffffffffffaec,
                                                   in_stack_fffffffffffffae8),
                                    in_stack_fffffffffffffae0);
    }
    else {
      local_3fc = rec_mm_arith((jit_State *)&in_stack_fffffffffffffaf0->field_2,
                               (RecordIndex *)
                               CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8),mm_00);
    }
    break;
  case IR_KNULL:
  case IR_KNUM:
  case IR_KINT64:
  case IR_KSLOT:
  case IR_BNOT:
    local_3b0 = local_3fc;
    local_298 = local_390[0xd];
    local_2a0 = local_3d0;
    local_2a8 = &local_3e0;
    local_3d0[0] = local_3e0;
    local_130 = "copy of dead GC object";
    local_2b0 = local_390[0xd];
    local_2b8 = &local_3e0;
    local_2c0 = &local_3d8;
    local_3e0 = local_3d8;
    local_118 = "copy of dead GC object";
    local_2c8 = local_390[0xd];
    local_2d0 = &local_3d8;
    local_2d8 = local_3d0;
    local_3d8 = dVar3;
    local_100 = "copy of dead GC object";
    TVar5 = local_46c;
    uVar15 = local_3fc;
    uVar6 = local_3fc;
    local_3ac = local_46c;
    local_128 = local_2a0;
    local_120 = local_298;
    local_110 = local_2b8;
    local_108 = local_2b0;
    local_f8 = local_2d0;
    local_f0 = local_2c8;
    if (op_00 == IR_BNOT) goto LAB_00180df0;
  case IR_KPRI:
  case IR_KINT:
  case IR_KGC:
  case IR_KPTR:
  case IR_BSWAP:
  case IR_BAND:
  case IR_BOR:
  case IR_BXOR:
    local_3fc = TVar5;
    if ((((uVar15 >> 0x18 & 0x1f) - 0xe < 6) || ((uVar15 & 0x1f000000) == 0x4000000)) &&
       (((local_3fc >> 0x18 & 0x1f) - 0xe < 6 || ((local_3fc & 0x1f000000) == 0x4000000)))) {
      local_3fc = lj_opt_narrow_arith((jit_State *)
                                      CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),
                                      t,rc_00,(TValue *)
                                              CONCAT44(in_stack_fffffffffffffaec,
                                                       in_stack_fffffffffffffae8),
                                      in_stack_fffffffffffffae0,in_stack_fffffffffffffadc);
    }
    else {
      local_3fc = rec_mm_arith((jit_State *)&in_stack_fffffffffffffaf0->field_2,
                               (RecordIndex *)
                               CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8),mm_00);
    }
    break;
  case IR_BSHR:
    if ((((local_46c >> 0x18 & 0x1f) - 0xe < 6) || ((local_46c & 0x1f000000) == 0x4000000)) &&
       (((local_3fc >> 0x18 & 0x1f) - 0xe < 6 || ((local_3fc & 0x1f000000) == 0x4000000)))) {
      local_3fc = lj_opt_narrow_arith((jit_State *)
                                      CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),
                                      t,rc_00,(TValue *)
                                              CONCAT44(in_stack_fffffffffffffaec,
                                                       in_stack_fffffffffffffae8),
                                      in_stack_fffffffffffffae0,in_stack_fffffffffffffadc);
    }
    else {
      local_3fc = rec_mm_arith((jit_State *)&in_stack_fffffffffffffaf0->field_2,
                               (RecordIndex *)
                               CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8),mm_00);
    }
    break;
  case IR_BSAR:
    local_3fc = rec_cat(in_stack_fffffffffffffb38,(BCReg)((ulong)in_stack_fffffffffffffb30 >> 0x20),
                        (BCReg)in_stack_fffffffffffffb30);
    if (0xfffffeff < local_3fc) {
      lj_err_throw((lua_State *)&in_stack_fffffffffffffae0->field_2,in_stack_fffffffffffffadc);
    }
    break;
  case IR_BROL:
  case IR_SUB:
  case IR_MUL:
    break;
  case IR_BROR:
    local_3fc = lj_ir_kgc(in_stack_fffffffffffffb00,
                          (GCobj *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),t);
    break;
  case IR_ADD:
    local_3fc = lj_ir_kint((jit_State *)&in_stack_fffffffffffffaf0->field_2,
                           in_stack_fffffffffffffaec);
    break;
  case IR_DIV:
    for (; uVar14 <= local_3fc; uVar14 = uVar14 + 1) {
      *(undefined4 *)(local_390[0x11].u64 + (ulong)uVar14 * 4) = 0x7fff;
    }
    if (*(uint *)((long)local_390 + 0x94) <= local_3fc) {
      *(TRef *)((long)local_390 + 0x94) = local_3fc + 1;
    }
    break;
  case IR_MOD:
    local_3fc = rec_upvalue((jit_State *)&in_stack_fffffffffffffb30->field_2,uv,
                            (TRef)in_stack_fffffffffffffb28);
    break;
  case IR_POW:
  case IR_NEG:
  case IR_ABS:
  case IR_LDEXP:
    rec_upvalue((jit_State *)&in_stack_fffffffffffffb30->field_2,uv,(TRef)in_stack_fffffffffffffb28)
    ;
    break;
  case IR_MIN:
  case IR_MAX:
  case IR_SLOAD:
  case IR_ASTORE:
switchD_001800e7_caseD_32:
    local_1c0 = local_390 + 0x141;
    local_1c0->n = (double)op_00;
    local_1c4 = op_00;
    lj_trace_err_info((jit_State *)&in_stack_fffffffffffffae0->field_2,in_stack_fffffffffffffadc);
  case IR_FPMATH:
    local_3fc = rec_tnew((jit_State *)&in_stack_fffffffffffffae0->field_2,in_stack_fffffffffffffadc)
    ;
    break;
  case IR_ADDOV:
    pTVar13 = local_390;
    TVar5 = lj_ir_kgc(in_stack_fffffffffffffb00,
                      (GCobj *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),t);
    local_382 = 0x508b;
    local_384 = (undefined2)TVar5;
    local_386 = 0;
    *(undefined2 *)((long)pTVar13 + 0xa4) = 0x508b;
    *(undefined2 *)(pTVar13 + 0x14) = local_384;
    *(undefined2 *)((long)pTVar13 + 0xa2) = 0;
    local_3fc = lj_opt_fold((jit_State *)
                            CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
    break;
  case IR_SUBOV:
  case IR_MULOV:
    local_208 = local_390[0xd];
    local_210 = &local_3e0;
    local_218 = (ulong)*(uint *)(local_390[0xf].u64 + 8);
    local_64 = 0xfffffff4;
    local_2c = 0xfffffff4;
    local_3e0 = (double)CONCAT44(local_3e0._4_4_,*(uint *)(local_390[0xf].u64 + 8));
    local_3e0._4_4_ = 0xfffffff4;
    local_48 = "store to dead GC object";
    pTVar13 = local_390;
    local_60 = local_218;
    local_58 = local_210;
    local_50 = local_208;
    local_40 = local_210;
    local_38 = local_208;
    local_28 = local_218;
    local_20 = local_210;
    TVar5 = getcurrf((jit_State *)CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8));
    local_372 = 0x440b;
    local_374 = (undefined2)TVar5;
    local_376 = 1;
    *(undefined2 *)((long)pTVar13 + 0xa4) = 0x440b;
    *(undefined2 *)(pTVar13 + 0x14) = local_374;
    *(undefined2 *)((long)pTVar13 + 0xa2) = 1;
    local_3b0 = lj_opt_fold((jit_State *)
                            CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
    local_39c = 100;
    local_3fc = lj_record_idx(in_stack_fffffffffffffba0,
                              (RecordIndex *)CONCAT44(in_stack_fffffffffffffb9c,uVar6));
    break;
  case IR_HREF:
  case IR_FREF:
    local_1b0 = &local_3d8;
    local_1b4 = local_3fc;
    local_3d8 = (double)(int)local_3fc;
    local_3ac = lj_ir_kint((jit_State *)&in_stack_fffffffffffffaf0->field_2,
                           in_stack_fffffffffffffaec);
  case IR_AREF:
  case IR_HREFK:
  case IR_UREFO:
  case IR_UREFC:
    local_39c = 100;
    local_3fc = lj_record_idx(in_stack_fffffffffffffba0,
                              (RecordIndex *)CONCAT44(in_stack_fffffffffffffb9c,uVar6));
    break;
  case IR_NEWREF:
  case IR_LREF:
    local_39c = 0;
    local_3fc = lj_record_idx(in_stack_fffffffffffffba0,
                              (RecordIndex *)CONCAT44(in_stack_fffffffffffffb9c,uVar6));
    break;
  case IR_STRREF:
    rec_tsetm(in_stack_fffffffffffffb48,(BCReg)((ulong)in_stack_fffffffffffffb40 >> 0x20),
              (BCReg)in_stack_fffffffffffffb40,tr);
    *(uint *)((long)local_390 + 0x94) = uVar14;
    break;
  case IR_ALOAD:
    local_3fc = (int)(*(long *)(local_390[0xd].u64 + 0x18) - *(long *)(local_390[0xd].u64 + 0x10) >>
                     3) - uVar14;
  case IR_HLOAD:
    lj_record_call((jit_State *)&in_stack_fffffffffffffae0->field_2,in_stack_fffffffffffffadc,
                   0x181875);
    break;
  case IR_ULOAD:
    local_3fc = (int)(*(long *)(local_390[0xd].u64 + 0x18) - *(long *)(local_390[0xd].u64 + 0x10) >>
                     3) - uVar14;
  case IR_FLOAD:
    lj_record_tailcall((jit_State *)&in_stack_fffffffffffffaf0->field_2,in_stack_fffffffffffffaec,
                       (ptrdiff_t)in_stack_fffffffffffffae0);
    break;
  case IR_XLOAD:
    if (*(int *)(local_390[0x11].u64 + (ulong)(uVar14 - 3) * 4) == 0) {
      local_4a4 = sload((jit_State *)&in_stack_fffffffffffffae0->field_2,in_stack_fffffffffffffadc);
    }
    else {
      local_4a4 = *(TRef *)(local_390[0x11].u64 + (ulong)(uVar14 - 3) * 4);
    }
    *(TRef *)(local_390[0x11].u64 + (ulong)uVar14 * 4) = local_4a4;
    if (*(int *)(local_390[0x11].u64 + (ulong)(uVar14 - 2) * 4) == 0) {
      local_4a8 = sload((jit_State *)&in_stack_fffffffffffffae0->field_2,in_stack_fffffffffffffadc);
    }
    else {
      local_4a8 = *(TRef *)(local_390[0x11].u64 + (ulong)(uVar14 - 2) * 4);
    }
    *(TRef *)(local_390[0x11].u64 + (ulong)(uVar14 + 1) * 4) = local_4a8;
    if (*(int *)(local_390[0x11].u64 + (ulong)(uVar14 - 1) * 4) == 0) {
      local_4ac = sload((jit_State *)&in_stack_fffffffffffffae0->field_2,in_stack_fffffffffffffadc);
    }
    else {
      local_4ac = *(TRef *)(local_390[0x11].u64 + (ulong)(uVar14 - 1) * 4);
    }
    *(TRef *)(local_390[0x11].u64 + (ulong)(uVar14 + 2) * 4) = local_4ac;
    local_2e8 = (undefined8 *)(*(long *)(local_390[0xd].u64 + 0x10) + (ulong)uVar14 * 8);
    local_2e0 = local_390[0xd];
    local_2f0 = local_2e8 + -3;
    *local_2e8 = *local_2f0;
    local_e8 = "copy of dead GC object";
    local_2f8 = local_390[0xd];
    local_300 = local_2e8 + 1;
    local_308 = local_2e8 + -2;
    *local_300 = *local_308;
    local_d0 = "copy of dead GC object";
    local_310 = local_390[0xd];
    local_318 = local_2e8 + 2;
    local_320 = local_2e8 + -1;
    *local_318 = *local_320;
    local_b8 = "copy of dead GC object";
    local_e0 = local_2e8;
    local_d8 = local_2e0;
    local_c8 = local_300;
    local_c0 = local_2f8;
    local_b0 = local_318;
    local_a8 = local_310;
    lj_record_call((jit_State *)&in_stack_fffffffffffffae0->field_2,in_stack_fffffffffffffadc,
                   0x181817);
    break;
  case IR_VLOAD:
    rec_varg(J_00,dst,CONCAT44(uVar14,local_46c));
    break;
  case IR_HSTORE:
    local_3fc = ((int)(*(long *)(local_390[0xd].u64 + 0x18) - *(long *)(local_390[0xd].u64 + 0x10)
                      >> 3) - uVar14) + 1;
  case IR_USTORE:
  case IR_FSTORE:
  case IR_XSTORE:
    rec_profile_ret((jit_State *)0x181943);
    lj_record_ret((jit_State *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),rbase,
                  in_stack_fffffffffffffb60);
    break;
  case IR_SNEW:
    LVar9 = rec_for((jit_State *)&in_stack_fffffffffffffb30->field_2,in_stack_fffffffffffffb28,iVar8
                   );
    if (LVar9 != LOOPEV_LEAVE) {
      local_390[0x29].field_2.field_0 = local_390[1].field_2.field_0;
    }
    break;
  case IR_XSNEW:
    LVar9 = rec_for((jit_State *)&in_stack_fffffffffffffb30->field_2,in_stack_fffffffffffffb28,iVar8
                   );
    if (LVar9 != LOOPEV_LEAVE) {
      lj_record_stop((jit_State *)&in_stack_fffffffffffffae0->field_2,in_stack_fffffffffffffadc,
                     in_stack_fffffffffffffad8);
    }
    break;
  case IR_TNEW:
    rec_for((jit_State *)&in_stack_fffffffffffffb30->field_2,in_stack_fffffffffffffb28,iVar8);
    rec_loop_interp((jit_State *)&in_stack_fffffffffffffae0->field_2,
                    (BCIns *)CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8),
                    LOOPEV_LEAVE);
    break;
  case IR_TDUP:
  case IR_BUFHDR:
  case IR_TBAR:
  case IR_TOBIT:
  case IR_CALLN:
    lj_trace_err((jit_State *)&in_stack_fffffffffffffae0->field_2,in_stack_fffffffffffffadc);
  case IR_CNEW:
    rec_for((jit_State *)&in_stack_fffffffffffffb30->field_2,in_stack_fffffffffffffb28,iVar8);
    rec_loop_jit((jit_State *)&in_stack_fffffffffffffae0->field_2,in_stack_fffffffffffffadc,
                 in_stack_fffffffffffffad8);
    break;
  case IR_CNEWI:
    rec_iterl((jit_State *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8),mm_00);
    rec_loop_interp((jit_State *)&in_stack_fffffffffffffae0->field_2,
                    (BCIns *)CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8),
                    LOOPEV_LEAVE);
    break;
  case IR_BUFPUT:
    rec_iterl((jit_State *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8),mm_00);
    rec_loop_jit((jit_State *)&in_stack_fffffffffffffae0->field_2,in_stack_fffffffffffffadc,
                 in_stack_fffffffffffffad8);
    break;
  case IR_BUFSTR:
    rec_loop((jit_State *)&local_390->field_2,uVar14,1);
    rec_loop_interp((jit_State *)&in_stack_fffffffffffffae0->field_2,
                    (BCIns *)CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8),
                    LOOPEV_LEAVE);
    break;
  case IR_OBAR:
    local_324 = *(uint *)((ulong)*(uint *)(local_390[0x2e].u64 + (ulong)local_3fc * 4) + 0x38) &
                0xff;
    bVar12 = true;
    if (((local_324 != 0x49) && (bVar12 = true, local_324 != 0x4a)) &&
       (bVar12 = true, local_324 != 0x4b)) {
      bVar12 = local_324 == 0x4c;
    }
    in_stack_fffffffffffffae0 = local_390;
    rec_loop((jit_State *)&local_390->field_2,uVar14,(uint)((bVar12 ^ 0xffU) & 1));
    rec_loop_jit((jit_State *)&in_stack_fffffffffffffae0->field_2,in_stack_fffffffffffffadc,
                 in_stack_fffffffffffffad8);
    break;
  case IR_XBAR:
    if (uVar14 < *(uint *)((long)local_390 + 0x94)) {
      *(uint *)((long)local_390 + 0x94) = uVar14;
    }
    break;
  case IR_CONV:
    rec_func_lua((jit_State *)0x181ccb);
    break;
  case IR_TOSTR:
    rec_func_jit((jit_State *)&in_stack_fffffffffffffae0->field_2,in_stack_fffffffffffffadc);
    break;
  case IR_STRTO:
    rec_func_vararg((jit_State *)&in_stack_fffffffffffffaf0->field_2);
    rec_func_lua((jit_State *)0x181d03);
    break;
  case IR_CALLA:
    break;
  case IR_CALLL:
  case IR_CALLS:
    lj_ffrecord_func((jit_State *)&in_stack_fffffffffffffaf0->field_2);
    break;
  default:
    if (op_00 < IR_CALLXS) goto switchD_001800e7_caseD_32;
    lj_ffrecord_func((jit_State *)&in_stack_fffffffffffffaf0->field_2);
  }
  if ((((lj_bc_mode[op_00] & 7) == 1) && (local_3fc != 0)) &&
     (*(TRef *)(local_390[0x11].u64 + (ulong)uVar14 * 4) = local_3fc,
     *(uint *)((long)local_390 + 0x94) <= uVar14)) {
    *(uint *)((long)local_390 + 0x94) = uVar14 + 1;
  }
  if ((local_390[1].u32.lo <= local_390[0xc9].u32.lo + 0x8001) &&
     (0x8000U - *(int *)((long)local_390 + 0x64c) <= local_390[3].u32.lo)) {
    return;
  }
  lj_trace_err((jit_State *)&in_stack_fffffffffffffae0->field_2,in_stack_fffffffffffffadc);
}

Assistant:

void lj_record_ins(jit_State *J)
{
  cTValue *lbase;
  RecordIndex ix;
  const BCIns *pc;
  BCIns ins;
  BCOp op;
  TRef ra, rb, rc;

  /* Perform post-processing action before recording the next instruction. */
  if (LJ_UNLIKELY(J->postproc != LJ_POST_NONE)) {
    switch (J->postproc) {
    case LJ_POST_FIXCOMP:  /* Fixup comparison. */
      pc = (const BCIns *)(uintptr_t)J2G(J)->tmptv.u64;
      rec_comp_fixup(J, pc, (!tvistruecond(&J2G(J)->tmptv2) ^ (bc_op(*pc)&1)));
      /* fallthrough */
    case LJ_POST_FIXGUARD:  /* Fixup and emit pending guard. */
    case LJ_POST_FIXGUARDSNAP:  /* Fixup and emit pending guard and snapshot. */
      if (!tvistruecond(&J2G(J)->tmptv2)) {
	J->fold.ins.o ^= 1;  /* Flip guard to opposite. */
	if (J->postproc == LJ_POST_FIXGUARDSNAP) {
	  SnapShot *snap = &J->cur.snap[J->cur.nsnap-1];
	  J->cur.snapmap[snap->mapofs+snap->nent-1]--;  /* False -> true. */
	}
      }
      lj_opt_fold(J);  /* Emit pending guard. */
      /* fallthrough */
    case LJ_POST_FIXBOOL:
      if (!tvistruecond(&J2G(J)->tmptv2)) {
	BCReg s;
	TValue *tv = J->L->base;
	for (s = 0; s < J->maxslot; s++)  /* Fixup stack slot (if any). */
	  if (J->base[s] == TREF_TRUE && tvisfalse(&tv[s])) {
	    J->base[s] = TREF_FALSE;
	    break;
	  }
      }
      break;
    case LJ_POST_FIXCONST:
      {
	BCReg s;
	TValue *tv = J->L->base;
	for (s = 0; s < J->maxslot; s++)  /* Constify stack slots (if any). */
	  if (J->base[s] == TREF_NIL && !tvisnil(&tv[s]))
	    J->base[s] = lj_record_constify(J, &tv[s]);
      }
      break;
    case LJ_POST_FFRETRY:  /* Suppress recording of retried fast function. */
      if (bc_op(*J->pc) >= BC__MAX)
	return;
      break;
    default: lj_assertJ(0, "bad post-processing mode"); break;
    }
    J->postproc = LJ_POST_NONE;
  }

  /* Need snapshot before recording next bytecode (e.g. after a store). */
  if (J->needsnap) {
    J->needsnap = 0;
    if (J->pt) lj_snap_purge(J);
    lj_snap_add(J);
    J->mergesnap = 1;
  }

  /* Skip some bytecodes. */
  if (LJ_UNLIKELY(J->bcskip > 0)) {
    J->bcskip--;
    return;
  }

  /* Record only closed loops for root traces. */
  pc = J->pc;
  if (J->framedepth == 0 &&
     (MSize)((char *)pc - (char *)J->bc_min) >= J->bc_extent)
    lj_trace_err(J, LJ_TRERR_LLEAVE);

#ifdef LUA_USE_ASSERT
  rec_check_slots(J);
  rec_check_ir(J);
#endif

#if LJ_HASPROFILE
  rec_profile_ins(J, pc);
#endif

  /* Keep a copy of the runtime values of var/num/str operands. */
#define rav	(&ix.valv)
#define rbv	(&ix.tabv)
#define rcv	(&ix.keyv)

  lbase = J->L->base;
  ins = *pc;
  op = bc_op(ins);
  ra = bc_a(ins);
  ix.val = 0;
  switch (bcmode_a(op)) {
  case BCMvar:
    copyTV(J->L, rav, &lbase[ra]); ix.val = ra = getslot(J, ra); break;
  default: break;  /* Handled later. */
  }
  rb = bc_b(ins);
  rc = bc_c(ins);
  switch (bcmode_b(op)) {
  case BCMnone: rb = 0; rc = bc_d(ins); break;  /* Upgrade rc to 'rd'. */
  case BCMvar:
    copyTV(J->L, rbv, &lbase[rb]); ix.tab = rb = getslot(J, rb); break;
  default: break;  /* Handled later. */
  }
  switch (bcmode_c(op)) {
  case BCMvar:
    copyTV(J->L, rcv, &lbase[rc]); ix.key = rc = getslot(J, rc); break;
  case BCMpri: setpriV(rcv, ~rc); ix.key = rc = TREF_PRI(IRT_NIL+rc); break;
  case BCMnum: { cTValue *tv = proto_knumtv(J->pt, rc);
    copyTV(J->L, rcv, tv); ix.key = rc = tvisint(tv) ? lj_ir_kint(J, intV(tv)) :
    lj_ir_knumint(J, numV(tv)); } break;
  case BCMstr: { GCstr *s = gco2str(proto_kgc(J->pt, ~(ptrdiff_t)rc));
    setstrV(J->L, rcv, s); ix.key = rc = lj_ir_kstr(J, s); } break;
  default: break;  /* Handled later. */
  }

  switch (op) {

  /* -- Comparison ops ---------------------------------------------------- */

  case BC_ISLT: case BC_ISGE: case BC_ISLE: case BC_ISGT:
#if LJ_HASFFI
    if (tref_iscdata(ra) || tref_iscdata(rc)) {
      rec_mm_comp_cdata(J, &ix, op, ((int)op & 2) ? MM_le : MM_lt);
      break;
    }
#endif
    /* Emit nothing for two numeric or string consts. */
    if (!(tref_isk2(ra,rc) && tref_isnumber_str(ra) && tref_isnumber_str(rc))) {
      IRType ta = tref_isinteger(ra) ? IRT_INT : tref_type(ra);
      IRType tc = tref_isinteger(rc) ? IRT_INT : tref_type(rc);
      int irop;
      if (ta != tc) {
	/* Widen mixed number/int comparisons to number/number comparison. */
	if (ta == IRT_INT && tc == IRT_NUM) {
	  ra = emitir(IRTN(IR_CONV), ra, IRCONV_NUM_INT);
	  ta = IRT_NUM;
	} else if (ta == IRT_NUM && tc == IRT_INT) {
	  rc = emitir(IRTN(IR_CONV), rc, IRCONV_NUM_INT);
	} else if (LJ_52) {
	  ta = IRT_NIL;  /* Force metamethod for different types. */
	} else if (!((ta == IRT_FALSE || ta == IRT_TRUE) &&
		     (tc == IRT_FALSE || tc == IRT_TRUE))) {
	  break;  /* Interpreter will throw for two different types. */
	}
      }
      rec_comp_prep(J);
      irop = (int)op - (int)BC_ISLT + (int)IR_LT;
      if (ta == IRT_NUM) {
	if ((irop & 1)) irop ^= 4;  /* ISGE/ISGT are unordered. */
	if (!lj_ir_numcmp(numberVnum(rav), numberVnum(rcv), (IROp)irop))
	  irop ^= 5;
      } else if (ta == IRT_INT) {
	if (!lj_ir_numcmp(numberVnum(rav), numberVnum(rcv), (IROp)irop))
	  irop ^= 1;
      } else if (ta == IRT_STR) {
	if (!lj_ir_strcmp(strV(rav), strV(rcv), (IROp)irop)) irop ^= 1;
	ra = lj_ir_call(J, IRCALL_lj_str_cmp, ra, rc);
	rc = lj_ir_kint(J, 0);
	ta = IRT_INT;
      } else {
	rec_mm_comp(J, &ix, (int)op);
	break;
      }
      emitir(IRTG(irop, ta), ra, rc);
      rec_comp_fixup(J, J->pc, ((int)op ^ irop) & 1);
    }
    break;

  case BC_ISEQV: case BC_ISNEV:
  case BC_ISEQS: case BC_ISNES:
  case BC_ISEQN: case BC_ISNEN:
  case BC_ISEQP: case BC_ISNEP:
#if LJ_HASFFI
    if (tref_iscdata(ra) || tref_iscdata(rc)) {
      rec_mm_comp_cdata(J, &ix, op, MM_eq);
      break;
    }
#endif
    /* Emit nothing for two non-table, non-udata consts. */
    if (!(tref_isk2(ra, rc) && !(tref_istab(ra) || tref_isudata(ra)))) {
      int diff;
      rec_comp_prep(J);
      diff = lj_record_objcmp(J, ra, rc, rav, rcv);
      if (diff == 2 || !(tref_istab(ra) || tref_isudata(ra)))
	rec_comp_fixup(J, J->pc, ((int)op & 1) == !diff);
      else if (diff == 1)  /* Only check __eq if different, but same type. */
	rec_mm_equal(J, &ix, (int)op);
    }
    break;

  /* -- Unary test and copy ops ------------------------------------------- */

  case BC_ISTC: case BC_ISFC:
    if ((op & 1) == tref_istruecond(rc))
      rc = 0;  /* Don't store if condition is not true. */
    /* fallthrough */
  case BC_IST: case BC_ISF:  /* Type specialization suffices. */
    if (bc_a(pc[1]) < J->maxslot)
      J->maxslot = bc_a(pc[1]);  /* Shrink used slots. */
    break;

  case BC_ISTYPE: case BC_ISNUM:
    /* These coercions need to correspond with lj_meta_istype(). */
    if (LJ_DUALNUM && rc == ~LJ_TNUMX+1)
      ra = lj_opt_narrow_toint(J, ra);
    else if (rc == ~LJ_TNUMX+2)
      ra = lj_ir_tonum(J, ra);
    else if (rc == ~LJ_TSTR+1)
      ra = lj_ir_tostr(J, ra);
    /* else: type specialization suffices. */
    J->base[bc_a(ins)] = ra;
    break;

  /* -- Unary ops --------------------------------------------------------- */

  case BC_NOT:
    /* Type specialization already forces const result. */
    rc = tref_istruecond(rc) ? TREF_FALSE : TREF_TRUE;
    break;

  case BC_LEN:
    if (tref_isstr(rc))
      rc = emitir(IRTI(IR_FLOAD), rc, IRFL_STR_LEN);
    else if (!LJ_52 && tref_istab(rc))
      rc = lj_ir_call(J, IRCALL_lj_tab_len, rc);
    else
      rc = rec_mm_len(J, rc, rcv);
    break;

  /* -- Arithmetic ops ---------------------------------------------------- */

  case BC_UNM:
    if (tref_isnumber_str(rc)) {
      rc = lj_opt_narrow_unm(J, rc, rcv);
    } else {
      ix.tab = rc;
      copyTV(J->L, &ix.tabv, rcv);
      rc = rec_mm_arith(J, &ix, MM_unm);
    }
    break;

  case BC_ADDNV: case BC_SUBNV: case BC_MULNV: case BC_DIVNV: case BC_MODNV:
    /* Swap rb/rc and rbv/rcv. rav is temp. */
    ix.tab = rc; ix.key = rc = rb; rb = ix.tab;
    copyTV(J->L, rav, rbv);
    copyTV(J->L, rbv, rcv);
    copyTV(J->L, rcv, rav);
    if (op == BC_MODNV)
      goto recmod;
    /* fallthrough */
  case BC_ADDVN: case BC_SUBVN: case BC_MULVN: case BC_DIVVN:
  case BC_ADDVV: case BC_SUBVV: case BC_MULVV: case BC_DIVVV: {
    MMS mm = bcmode_mm(op);
    if (tref_isnumber_str(rb) && tref_isnumber_str(rc))
      rc = lj_opt_narrow_arith(J, rb, rc, rbv, rcv,
			       (int)mm - (int)MM_add + (int)IR_ADD);
    else
      rc = rec_mm_arith(J, &ix, mm);
    break;
    }

  case BC_MODVN: case BC_MODVV:
  recmod:
    if (tref_isnumber_str(rb) && tref_isnumber_str(rc))
      rc = lj_opt_narrow_mod(J, rb, rc, rbv, rcv);
    else
      rc = rec_mm_arith(J, &ix, MM_mod);
    break;

  case BC_POW:
    if (tref_isnumber_str(rb) && tref_isnumber_str(rc))
      rc = lj_opt_narrow_arith(J, rb, rc, rbv, rcv, IR_POW);
    else
      rc = rec_mm_arith(J, &ix, MM_pow);
    break;

  /* -- Miscellaneous ops ------------------------------------------------- */

  case BC_CAT:
    rc = rec_cat(J, rb, rc);
    if (rc >= 0xffffff00)
      lj_err_throw(J->L, -(int32_t)rc);  /* Propagate errors. */
    break;

  /* -- Constant and move ops --------------------------------------------- */

  case BC_MOV:
    /* Clear gap of method call to avoid resurrecting previous refs. */
    if (ra > J->maxslot) {
#if LJ_FR2
      memset(J->base + J->maxslot, 0, (ra - J->maxslot) * sizeof(TRef));
#else
      J->base[ra-1] = 0;
#endif
    }
    break;
  case BC_KSTR: case BC_KNUM: case BC_KPRI:
    break;
  case BC_KSHORT:
    rc = lj_ir_kint(J, (int32_t)(int16_t)rc);
    break;
  case BC_KNIL:
    if (LJ_FR2 && ra > J->maxslot)
      J->base[ra-1] = 0;
    while (ra <= rc)
      J->base[ra++] = TREF_NIL;
    if (rc >= J->maxslot) J->maxslot = rc+1;
    break;
#if LJ_HASFFI
  case BC_KCDATA:
    rc = lj_ir_kgc(J, proto_kgc(J->pt, ~(ptrdiff_t)rc), IRT_CDATA);
    break;
#endif

  /* -- Upvalue and function ops ------------------------------------------ */

  case BC_UGET:
    rc = rec_upvalue(J, rc, 0);
    break;
  case BC_USETV: case BC_USETS: case BC_USETN: case BC_USETP:
    rec_upvalue(J, ra, rc);
    break;

  /* -- Table ops --------------------------------------------------------- */

  case BC_GGET: case BC_GSET:
    settabV(J->L, &ix.tabv, tabref(J->fn->l.env));
    ix.tab = emitir(IRT(IR_FLOAD, IRT_TAB), getcurrf(J), IRFL_FUNC_ENV);
    ix.idxchain = LJ_MAX_IDXCHAIN;
    rc = lj_record_idx(J, &ix);
    break;

  case BC_TGETB: case BC_TSETB:
    setintV(&ix.keyv, (int32_t)rc);
    ix.key = lj_ir_kint(J, (int32_t)rc);
    /* fallthrough */
  case BC_TGETV: case BC_TGETS: case BC_TSETV: case BC_TSETS:
    ix.idxchain = LJ_MAX_IDXCHAIN;
    rc = lj_record_idx(J, &ix);
    break;
  case BC_TGETR: case BC_TSETR:
    ix.idxchain = 0;
    rc = lj_record_idx(J, &ix);
    break;

  case BC_TSETM:
    rec_tsetm(J, ra, (BCReg)(J->L->top - J->L->base), (int32_t)rcv->u32.lo);
    J->maxslot = ra;  /* The table slot at ra-1 is the highest used slot. */
    break;

  case BC_TNEW:
    rc = rec_tnew(J, rc);
    break;
  case BC_TDUP:
    rc = emitir(IRTG(IR_TDUP, IRT_TAB),
		lj_ir_ktab(J, gco2tab(proto_kgc(J->pt, ~(ptrdiff_t)rc))), 0);
#ifdef LUAJIT_ENABLE_TABLE_BUMP
    J->rbchash[(rc & (RBCHASH_SLOTS-1))].ref = tref_ref(rc);
    setmref(J->rbchash[(rc & (RBCHASH_SLOTS-1))].pc, pc);
    setgcref(J->rbchash[(rc & (RBCHASH_SLOTS-1))].pt, obj2gco(J->pt));
#endif
    break;

  /* -- Calls and vararg handling ----------------------------------------- */

  case BC_ITERC:
    J->base[ra] = getslot(J, ra-3);
    J->base[ra+1+LJ_FR2] = getslot(J, ra-2);
    J->base[ra+2+LJ_FR2] = getslot(J, ra-1);
    { /* Do the actual copy now because lj_record_call needs the values. */
      TValue *b = &J->L->base[ra];
      copyTV(J->L, b, b-3);
      copyTV(J->L, b+1+LJ_FR2, b-2);
      copyTV(J->L, b+2+LJ_FR2, b-1);
    }
    lj_record_call(J, ra, (ptrdiff_t)rc-1);
    break;

  /* L->top is set to L->base+ra+rc+NARGS-1+1. See lj_dispatch_ins(). */
  case BC_CALLM:
    rc = (BCReg)(J->L->top - J->L->base) - ra - LJ_FR2;
    /* fallthrough */
  case BC_CALL:
    lj_record_call(J, ra, (ptrdiff_t)rc-1);
    break;

  case BC_CALLMT:
    rc = (BCReg)(J->L->top - J->L->base) - ra - LJ_FR2;
    /* fallthrough */
  case BC_CALLT:
    lj_record_tailcall(J, ra, (ptrdiff_t)rc-1);
    break;

  case BC_VARG:
    rec_varg(J, ra, (ptrdiff_t)rb-1);
    break;

  /* -- Returns ----------------------------------------------------------- */

  case BC_RETM:
    /* L->top is set to L->base+ra+rc+NRESULTS-1, see lj_dispatch_ins(). */
    rc = (BCReg)(J->L->top - J->L->base) - ra + 1;
    /* fallthrough */
  case BC_RET: case BC_RET0: case BC_RET1:
#if LJ_HASPROFILE
    rec_profile_ret(J);
#endif
    lj_record_ret(J, ra, (ptrdiff_t)rc-1);
    break;

  /* -- Loops and branches ------------------------------------------------ */

  case BC_FORI:
    if (rec_for(J, pc, 0) != LOOPEV_LEAVE)
      J->loopref = J->cur.nins;
    break;
  case BC_JFORI:
    lj_assertJ(bc_op(pc[(ptrdiff_t)rc-BCBIAS_J]) == BC_JFORL,
	       "JFORI does not point to JFORL");
    if (rec_for(J, pc, 0) != LOOPEV_LEAVE)  /* Link to existing loop. */
      lj_record_stop(J, LJ_TRLINK_ROOT, bc_d(pc[(ptrdiff_t)rc-BCBIAS_J]));
    /* Continue tracing if the loop is not entered. */
    break;

  case BC_FORL:
    rec_loop_interp(J, pc, rec_for(J, pc+((ptrdiff_t)rc-BCBIAS_J), 1));
    break;
  case BC_ITERL:
    rec_loop_interp(J, pc, rec_iterl(J, *pc));
    break;
  case BC_LOOP:
    rec_loop_interp(J, pc, rec_loop(J, ra, 1));
    break;

  case BC_JFORL:
    rec_loop_jit(J, rc, rec_for(J, pc+bc_j(traceref(J, rc)->startins), 1));
    break;
  case BC_JITERL:
    rec_loop_jit(J, rc, rec_iterl(J, traceref(J, rc)->startins));
    break;
  case BC_JLOOP:
    rec_loop_jit(J, rc, rec_loop(J, ra,
				 !bc_isret(bc_op(traceref(J, rc)->startins))));
    break;

  case BC_IFORL:
  case BC_IITERL:
  case BC_ILOOP:
  case BC_IFUNCF:
  case BC_IFUNCV:
    lj_trace_err(J, LJ_TRERR_BLACKL);
    break;

  case BC_JMP:
    if (ra < J->maxslot)
      J->maxslot = ra;  /* Shrink used slots. */
    break;

  /* -- Function headers -------------------------------------------------- */

  case BC_FUNCF:
    rec_func_lua(J);
    break;
  case BC_JFUNCF:
    rec_func_jit(J, rc);
    break;

  case BC_FUNCV:
    rec_func_vararg(J);
    rec_func_lua(J);
    break;
  case BC_JFUNCV:
    /* Cannot happen. No hotcall counting for varag funcs. */
    lj_assertJ(0, "unsupported vararg hotcall");
    break;

  case BC_FUNCC:
  case BC_FUNCCW:
    lj_ffrecord_func(J);
    break;

  default:
    if (op >= BC__MAX) {
      lj_ffrecord_func(J);
      break;
    }
    /* fallthrough */
  case BC_ITERN:
  case BC_ISNEXT:
  case BC_UCLO:
  case BC_FNEW:
    setintV(&J->errinfo, (int32_t)op);
    lj_trace_err_info(J, LJ_TRERR_NYIBC);
    break;
  }

  /* rc == 0 if we have no result yet, e.g. pending __index metamethod call. */
  if (bcmode_a(op) == BCMdst && rc) {
    J->base[ra] = rc;
    if (ra >= J->maxslot) {
#if LJ_FR2
      if (ra > J->maxslot) J->base[ra-1] = 0;
#endif
      J->maxslot = ra+1;
    }
  }

#undef rav
#undef rbv
#undef rcv

  /* Limit the number of recorded IR instructions and constants. */
  if (J->cur.nins > REF_FIRST+(IRRef)J->param[JIT_P_maxrecord] ||
      J->cur.nk < REF_BIAS-(IRRef)J->param[JIT_P_maxirconst])
    lj_trace_err(J, LJ_TRERR_TRACEOV);
}